

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_failurecount_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::StatementsFailureCount::GetResult
          (AssertionResult *__return_storage_ptr__,StatementsFailureCount *this,size_t cnt,
          char *stetements_str)

{
  bool bVar1;
  TestPartResult *this_00;
  AssertionResult *pAVar2;
  iuCodeMessage *this_01;
  char *local_90;
  ulong local_88;
  size_t i_1;
  AssertionResult local_70;
  undefined1 local_41;
  ulong local_40;
  size_t i;
  size_t n;
  size_t num;
  char *stetements_str_local;
  size_t cnt_local;
  StatementsFailureCount *this_local;
  AssertionResult *ar;
  
  num = (size_t)stetements_str;
  stetements_str_local = (char *)cnt;
  cnt_local = (size_t)this;
  this_local = (StatementsFailureCount *)__return_storage_ptr__;
  n = NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::count
                (&this->super_Collector<iutest::detail::NoTestPartResultReporter>);
  i = 0;
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    this_00 = NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
              GetTestPartResult(&this->super_Collector<iutest::detail::NoTestPartResultReporter>,
                                local_40);
    bVar1 = TestPartResult::failed(this_00);
    if (bVar1) {
      i = i + 1;
    }
  }
  if (i < stetements_str_local) {
    AssertionSuccess();
  }
  else {
    local_41 = 0;
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_70,(char **)&num);
    pAVar2 = AssertionResult::operator<<
                       (pAVar2,(char (*) [36])"\nExpected: failure count less than ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(unsigned_long *)&stetements_str_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&i);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    AssertionResult::~AssertionResult(&local_70);
    AssertionResult::operator<<(__return_storage_ptr__,(char (*) [19])"\nReported results:");
    for (local_88 = 0; local_88 < n; local_88 = local_88 + 1) {
      pAVar2 = AssertionResult::operator<<(__return_storage_ptr__,(char (*) [2])0x171294);
      this_01 = &NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
                 GetTestPartResult(&this->super_Collector<iutest::detail::NoTestPartResultReporter>,
                                   local_88)->super_iuCodeMessage;
      local_90 = iuCodeMessage::message(this_01);
      AssertionResult::operator<<(pAVar2,&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(size_t cnt, const char* stetements_str)
    {
        const size_t num = count();
        size_t n=0;
        for( size_t i=0; i < num; ++i )
        {
            if( GetTestPartResult(i).failed() )
            {
                ++n;
            }
        }
        if( n < cnt )
        {
            return AssertionSuccess();
        }
        AssertionResult ar = AssertionFailure() << stetements_str << "\nExpected: failure count less than " << cnt << "\n  Actual: " << n;
        ar << "\nReported results:";
        for( size_t i=0; i < num; ++i )
        {
            ar << "\n" << GetTestPartResult(i).message();
        }
        return ar;
    }